

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

uint32_t __thiscall AbstractModuleClient::latestTrodesTimestamp(AbstractModuleClient *this)

{
  int iVar1;
  void *pvVar2;
  undefined4 *puVar3;
  long lVar4;
  long in_RDI;
  zmq_msg_t msg;
  mutex *in_stack_ffffffffffffffb0;
  uint32_t local_4;
  
  if (*(long *)(in_RDI + 0x158) == 0) {
    local_4 = 0;
  }
  else {
    zmq_msg_init(&stack0xffffffffffffffb0);
    std::mutex::lock(in_stack_ffffffffffffffb0);
    pvVar2 = zsock_resolve(*(void **)(in_RDI + 0x158));
    iVar1 = zmq_msg_recv(&stack0xffffffffffffffb0,pvVar2,1);
    if (iVar1 == 0xc) {
      puVar3 = (undefined4 *)zmq_msg_data(&stack0xffffffffffffffb0);
      *(undefined4 *)(in_RDI + 0x180) = *puVar3;
      lVar4 = zmq_msg_data(&stack0xffffffffffffffb0);
      *(undefined8 *)(in_RDI + 0x188) = *(undefined8 *)(lVar4 + 4);
    }
    std::mutex::unlock((mutex *)0x1bc0ef);
    zmq_msg_close(&stack0xffffffffffffffb0);
    local_4 = *(uint32_t *)(in_RDI + 0x180);
  }
  return local_4;
}

Assistant:

uint32_t AbstractModuleClient::latestTrodesTimestamp(){
    if(!timestampsub){
        return 0;
    }
    //If zmq_recv succeeds, lastTimestamp is replaced. if not, the previous value is returned. win-win with no checks needed
    zmq_msg_t msg;
    zmq_msg_init(&msg);
    tsmutex.lock();
    if(zmq_msg_recv(&msg, zsock_resolve(timestampsub), ZMQ_DONTWAIT) == 12){
        lastTimestamp = *(uint32_t*)zmq_msg_data(&msg);
        lastsysTimestamp = *(int64_t*)((byte*)zmq_msg_data(&msg)+4);
    }
    tsmutex.unlock();
    zmq_msg_close(&msg);
    return lastTimestamp;
}